

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsInterface.cpp
# Opt level: O0

HighsStatus __thiscall Highs::optionChangeAction(Highs *this)

{
  vector<double,_std::allocator<double>_> *pvVar1;
  pointer *ppdVar2;
  bool bVar3;
  bool bVar4;
  reference pvVar5;
  int *piVar6;
  HighsModel *in_RDI;
  bool bVar7;
  double dVar8;
  HighsInt iRow_1;
  HighsInt iCol_1;
  double new_max_dual_infeasibility;
  bool user_cost_scale_ok;
  bool changed_user_cost_scale;
  double dl_user_cost_scale_value;
  HighsInt dl_user_cost_scale;
  HighsInt iRow;
  HighsInt iCol;
  double new_max_primal_infeasibility;
  bool user_bound_scale_ok;
  bool changed_user_bound_scale;
  double dl_user_bound_scale_value;
  HighsInt dl_user_bound_scale;
  bool is_mip;
  HighsOptions *options;
  HighsInfo *info;
  HighsLp *lp;
  HighsModel *model;
  HighsIis *in_stack_ffffffffffffff50;
  undefined7 in_stack_ffffffffffffff58;
  undefined1 in_stack_ffffffffffffff5f;
  HighsLp *in_stack_ffffffffffffff60;
  HighsLp *in_stack_ffffffffffffff68;
  HighsModel *this_00;
  undefined4 in_stack_ffffffffffffff78;
  undefined4 in_stack_ffffffffffffff7c;
  HighsInt user_bound_scale;
  char cVar9;
  undefined4 in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffff84;
  int iVar10;
  HighsIis *local_68;
  int local_5c;
  int local_58;
  int local_54;
  HighsLp *local_40;
  int local_38;
  HighsStatus local_4;
  
  piVar6 = (int *)((long)&(in_RDI->lp_).objective_name_.field_2 + 8);
  this_00 = in_RDI;
  bVar3 = HighsLp::isMip((HighsLp *)CONCAT17(in_stack_ffffffffffffff5f,in_stack_ffffffffffffff58));
  local_38 = 0;
  local_40 = (HighsLp *)0x3ff0000000000000;
  bVar7 = *(int *)((long)&in_RDI[3].lp_.col_upper_.
                          super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_finish + 4) !=
          *(int *)&(in_RDI->lp_).mods_.save_inf_cost_variable_index.
                   super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                   _M_start;
  user_bound_scale = CONCAT13(1,(int3)in_stack_ffffffffffffff7c);
  if (bVar7) {
    bVar4 = HighsLp::userBoundScaleOk
                      (in_stack_ffffffffffffff68,
                       (HighsInt)((ulong)in_stack_ffffffffffffff60 >> 0x20),
                       (double)CONCAT17(in_stack_ffffffffffffff5f,in_stack_ffffffffffffff58));
    user_bound_scale = CONCAT13(bVar4,(int3)user_bound_scale);
  }
  cVar9 = (char)((uint)user_bound_scale >> 0x18);
  if (cVar9 == '\0') {
    *(undefined4 *)
     ((long)&in_RDI[3].lp_.col_upper_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_finish + 4) =
         *(undefined4 *)
          &(in_RDI->lp_).mods_.save_inf_cost_variable_index.
           super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start;
    highsLogUser((HighsLogOptions *)
                 &this_00[3].lp_.mods_.save_non_semi_variable_index.
                  super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                  _M_end_of_storage,kError,
                 "New user bound scaling yields infinite bound: reverting user bound scaling to %d\n"
                 ,(ulong)*(uint *)((long)&in_RDI[3].lp_.col_upper_.
                                          super__Vector_base<double,_std::allocator<double>_>.
                                          _M_impl.super__Vector_impl_data._M_finish + 4));
  }
  else if (bVar7) {
    local_38 = *(int *)((long)&in_RDI[3].lp_.col_upper_.
                               super__Vector_base<double,_std::allocator<double>_>._M_impl.
                               super__Vector_impl_data._M_finish + 4) -
               *(int *)&(in_RDI->lp_).mods_.save_inf_cost_variable_index.
                        super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start;
    local_40 = (HighsLp *)std::pow<int,int>(0,0x4e3f5c);
  }
  dVar8 = (double)in_RDI[3].lp_.mods_.save_inf_cost_variable_cost.
                  super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start * (double)local_40;
  pvVar1 = &in_RDI[3].lp_.col_cost_;
  if (dVar8 < (double)(pvVar1->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                      super__Vector_impl_data._M_start ||
      dVar8 == (double)(pvVar1->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                       super__Vector_impl_data._M_start) {
    if ((!bVar3) &&
       (*(int *)((long)&in_RDI[3].lp_.mods_.save_tightened_semi_variable_upper_bound_index.
                        super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage + 4) == 1)) {
      highsLogUser((HighsLogOptions *)
                   &this_00[3].lp_.mods_.save_non_semi_variable_index.
                    super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                    _M_end_of_storage,kInfo,"Option change leads to gain of primal feasibility\n");
      *(undefined4 *)
       ((long)&in_RDI[3].lp_.mods_.save_tightened_semi_variable_upper_bound_index.
               super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
               _M_end_of_storage + 4) = 2;
      *(undefined4 *)
       &in_RDI[3].lp_.mods_.save_inf_cost_variable_index.
        super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage = 0;
    }
  }
  else if ((*(int *)&in_RDI[3].lp_.mods_.save_inf_cost_variable_index.
                     super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                     _M_end_of_storage == 0) && (1.0 < (double)local_40)) {
    *(undefined4 *)
     ((long)&this_00[4].lp_.mods_.save_inconsistent_semi_variable_lower_bound_value.
             super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
             _M_end_of_storage + 4) = 0;
    if (*(int *)((long)&in_RDI[3].lp_.mods_.save_tightened_semi_variable_upper_bound_index.
                        super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage + 4) == 2) {
      highsLogUser((HighsLogOptions *)
                   &this_00[3].lp_.mods_.save_non_semi_variable_index.
                    super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                    _M_end_of_storage,kInfo,"Option change leads to loss of primal feasibility\n");
    }
    *(undefined4 *)
     ((long)&in_RDI[3].lp_.mods_.save_tightened_semi_variable_upper_bound_index.
             super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_end_of_storage + 4) = 1;
    *(undefined4 *)
     &in_RDI[3].lp_.mods_.save_inf_cost_variable_index.super__Vector_base<int,_std::allocator<int>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = 0xffffffff;
  }
  if (((bVar3) && (local_38 != 0)) &&
     (*(undefined4 *)
       ((long)&this_00[4].lp_.mods_.save_inconsistent_semi_variable_lower_bound_value.
               super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
               _M_end_of_storage + 4) = 0, local_38 < 0)) {
    if (*(int *)((long)&in_RDI[3].lp_.mods_.save_tightened_semi_variable_upper_bound_index.
                        super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage + 4) == 2) {
      highsLogUser((HighsLogOptions *)
                   &this_00[3].lp_.mods_.save_non_semi_variable_index.
                    super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                    _M_end_of_storage,kInfo,
                   "Option change leads to loss of primal feasibility for MIP\n");
    }
    *(undefined4 *)
     ((long)&in_RDI[3].lp_.mods_.save_tightened_semi_variable_upper_bound_index.
             super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_end_of_storage + 4) = 1;
  }
  if (local_38 != 0) {
    in_RDI[3].lp_.mods_.save_tightened_semi_variable_upper_bound_value.
    super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_finish =
         (pointer)((double)local_40 *
                  (double)in_RDI[3].lp_.mods_.save_tightened_semi_variable_upper_bound_value.
                          super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_finish);
    in_RDI[3].lp_.mods_.save_inf_cost_variable_cost.
    super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start =
         (pointer)((double)local_40 *
                  (double)in_RDI[3].lp_.mods_.save_inf_cost_variable_cost.
                          super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
    in_RDI[3].lp_.mods_.save_inf_cost_variable_cost.
    super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_finish =
         (pointer)((double)local_40 *
                  (double)in_RDI[3].lp_.mods_.save_inf_cost_variable_cost.
                          super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_finish);
    for (local_54 = 0; local_54 < *piVar6; local_54 = local_54 + 1) {
      in_stack_ffffffffffffff68 = local_40;
      pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)
                          &(this_00->lp_).col_cost_.
                           super__Vector_base<double,_std::allocator<double>_>._M_impl.
                           super__Vector_impl_data._M_finish,(long)local_54);
      *pvVar5 = (double)in_stack_ffffffffffffff68 * *pvVar5;
    }
    for (local_58 = 0; local_58 < *(int *)((long)&(in_RDI->lp_).objective_name_.field_2 + 0xc);
        local_58 = local_58 + 1) {
      in_stack_ffffffffffffff60 = local_40;
      pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)
                          &(this_00->lp_).col_upper_.
                           super__Vector_base<double,_std::allocator<double>_>._M_impl.
                           super__Vector_impl_data._M_finish,(long)local_58);
      *pvVar5 = (double)in_stack_ffffffffffffff60 * *pvVar5;
    }
    HighsLp::userBoundScale
              ((HighsLp *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
               user_bound_scale);
  }
  local_5c = 0;
  local_68 = (HighsIis *)0x3ff0000000000000;
  bVar4 = *(int *)&in_RDI[3].lp_.col_upper_.super__Vector_base<double,_std::allocator<double>_>.
                   _M_impl.super__Vector_impl_data._M_end_of_storage !=
          *(int *)((long)&(in_RDI->lp_).mods_.save_inf_cost_variable_index.
                          super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start + 4);
  bVar7 = true;
  if (bVar4) {
    bVar7 = HighsModel::userCostScaleOk
                      ((HighsModel *)CONCAT44(user_bound_scale,in_stack_ffffffffffffff78),
                       (HighsInt)((ulong)this_00 >> 0x20),(double)in_stack_ffffffffffffff68,
                       (double)in_stack_ffffffffffffff60,
                       (double)CONCAT17(1,in_stack_ffffffffffffff58));
  }
  if (bVar7 == false) {
    *(undefined4 *)
     &in_RDI[3].lp_.col_upper_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage =
         *(undefined4 *)
          ((long)&(in_RDI->lp_).mods_.save_inf_cost_variable_index.
                  super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                  _M_start + 4);
    highsLogUser((HighsLogOptions *)
                 &this_00[3].lp_.mods_.save_non_semi_variable_index.
                  super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                  _M_end_of_storage,kError,
                 "New user cost scaling yields excessive cost coefficient: reverting user cost scaling to %d\n"
                 ,(ulong)*(uint *)&in_RDI[3].lp_.col_upper_.
                                   super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                   super__Vector_impl_data._M_end_of_storage);
  }
  else if (bVar4) {
    local_5c = *(int *)&in_RDI[3].lp_.col_upper_.super__Vector_base<double,_std::allocator<double>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage -
               *(int *)((long)&(in_RDI->lp_).mods_.save_inf_cost_variable_index.
                               super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_start + 4);
    local_68 = (HighsIis *)std::pow<int,int>(0,0x4e4338);
  }
  if (!bVar3) {
    dVar8 = (double)in_RDI[3].lp_.mods_.save_inf_cost_variable_lower.
                    super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start * (double)local_68;
    ppdVar2 = &in_RDI[3].lp_.col_cost_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_finish;
    if (dVar8 < (double)*ppdVar2 || dVar8 == (double)*ppdVar2) {
      if (*(int *)&in_RDI[3].lp_.mods_.save_tightened_semi_variable_upper_bound_value.
                   super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start == 1) {
        highsLogUser((HighsLogOptions *)
                     &this_00[3].lp_.mods_.save_non_semi_variable_index.
                      super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                      _M_end_of_storage,kInfo,"Option change leads to gain of dual feasibility\n");
        *(undefined4 *)
         &in_RDI[3].lp_.mods_.save_tightened_semi_variable_upper_bound_value.
          super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
          _M_start = 2;
        *(undefined4 *)
         &in_RDI[3].lp_.mods_.save_inf_cost_variable_cost.
          super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage = 0;
      }
    }
    else if ((*(int *)&in_RDI[3].lp_.mods_.save_inf_cost_variable_cost.
                       super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage == 0) && (1.0 < (double)local_68))
    {
      *(undefined4 *)
       ((long)&this_00[4].lp_.mods_.save_inconsistent_semi_variable_lower_bound_value.
               super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
               _M_end_of_storage + 4) = 0;
      if (*(int *)&in_RDI[3].lp_.mods_.save_tightened_semi_variable_upper_bound_value.
                   super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start == 2) {
        highsLogUser((HighsLogOptions *)
                     &this_00[3].lp_.mods_.save_non_semi_variable_index.
                      super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                      _M_end_of_storage,kInfo,"Option change leads to loss of dual feasibility\n");
        *(undefined4 *)
         &in_RDI[3].lp_.mods_.save_tightened_semi_variable_upper_bound_value.
          super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
          _M_start = 1;
      }
      *(undefined4 *)
       &in_RDI[3].lp_.mods_.save_inf_cost_variable_cost.
        super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage = 0xffffffff;
    }
  }
  if (local_5c != 0) {
    if (bVar3) {
      *(undefined4 *)
       ((long)&this_00[4].lp_.mods_.save_inconsistent_semi_variable_lower_bound_value.
               super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
               _M_end_of_storage + 4) = 0;
    }
    in_RDI[3].lp_.mods_.save_tightened_semi_variable_upper_bound_value.
    super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_finish =
         (pointer)((double)local_68 *
                  (double)in_RDI[3].lp_.mods_.save_tightened_semi_variable_upper_bound_value.
                          super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_finish);
    in_RDI[3].lp_.mods_.save_inf_cost_variable_lower.
    super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start =
         (pointer)((double)local_68 *
                  (double)in_RDI[3].lp_.mods_.save_inf_cost_variable_lower.
                          super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
    in_RDI[3].lp_.mods_.save_inf_cost_variable_lower.
    super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_finish =
         (pointer)((double)local_68 *
                  (double)in_RDI[3].lp_.mods_.save_inf_cost_variable_lower.
                          super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_finish);
    for (iVar10 = 0; iVar10 < *piVar6; iVar10 = iVar10 + 1) {
      in_stack_ffffffffffffff50 = local_68;
      pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)
                          &(this_00->lp_).col_lower_.
                           super__Vector_base<double,_std::allocator<double>_>._M_impl.
                           super__Vector_impl_data._M_finish,(long)iVar10);
      *pvVar5 = (double)in_stack_ffffffffffffff50 * *pvVar5;
    }
    for (iVar10 = 0; iVar10 < *(int *)((long)&(in_RDI->lp_).objective_name_.field_2 + 0xc);
        iVar10 = iVar10 + 1) {
      pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)
                          &(this_00->lp_).row_lower_.
                           super__Vector_base<double,_std::allocator<double>_>._M_impl.
                           super__Vector_impl_data._M_finish,(long)iVar10);
      *pvVar5 = (double)local_68 * *pvVar5;
    }
    HighsModel::userCostScale(this_00,(HighsInt)((ulong)in_stack_ffffffffffffff68 >> 0x20));
  }
  if (((*(int *)((long)&this_00[4].lp_.mods_.save_inconsistent_semi_variable_lower_bound_value.
                        super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage + 4) != 7) &&
      (*(int *)((long)&in_RDI[3].lp_.mods_.save_tightened_semi_variable_upper_bound_index.
                       super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
                       ._M_end_of_storage + 4) == 2)) &&
     (*(int *)&in_RDI[3].lp_.mods_.save_tightened_semi_variable_upper_bound_value.
               super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
               _M_start == 2)) {
    highsLogUser((HighsLogOptions *)
                 &this_00[3].lp_.mods_.save_non_semi_variable_index.
                  super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                  _M_end_of_storage,kInfo,"Option change leads to gain of optimality\n");
    *(undefined4 *)
     ((long)&this_00[4].lp_.mods_.save_inconsistent_semi_variable_lower_bound_value.
             super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
             _M_end_of_storage + 4) = 7;
  }
  if ((cVar9 == '\0') || (bVar7 == false)) {
    local_4 = kError;
  }
  else {
    if (((this_00[4].lp_.scale_.strategy & 1) != 0) &&
       (this_00[3].lp_.sense_ != *(ObjSense *)&this_00[4].lp_.scale_.has_scaling)) {
      HighsIis::invalidate(in_stack_ffffffffffffff50);
    }
    local_4 = kOk;
  }
  return local_4;
}

Assistant:

HighsStatus Highs::optionChangeAction() {
  HighsModel& model = this->model_;
  HighsLp& lp = model.lp_;
  HighsInfo& info = this->info_;
  HighsOptions& options = this->options_;
  const bool is_mip = lp.isMip();
  HighsInt dl_user_bound_scale = 0;
  double dl_user_bound_scale_value = 1;
  // Ensure that user bound scaling does not yield infinite bounds
  const bool changed_user_bound_scale =
      options.user_bound_scale != lp.user_bound_scale_;
  bool user_bound_scale_ok =
      !changed_user_bound_scale ||
      lp.userBoundScaleOk(options.user_bound_scale, options.infinite_bound);
  if (!user_bound_scale_ok) {
    options.user_bound_scale = lp.user_bound_scale_;
    highsLogUser(options_.log_options, HighsLogType::kError,
                 "New user bound scaling yields infinite bound: reverting user "
                 "bound scaling to %d\n",
                 int(options.user_bound_scale));
  } else if (changed_user_bound_scale) {
    dl_user_bound_scale = options.user_bound_scale - lp.user_bound_scale_;
    dl_user_bound_scale_value = std::pow(2, dl_user_bound_scale);
  }
  // Now consider impact on primal feasibility of user bound scaling
  // and/or primal_feasibility_tolerance change.
  //
  double new_max_primal_infeasibility =
      info.max_primal_infeasibility * dl_user_bound_scale_value;
  if (new_max_primal_infeasibility > options.primal_feasibility_tolerance) {
    // Not primal feasible: only act if the model is currently primal
    // feasible or dl_user_bound_scale_value > 1
    if (info.num_primal_infeasibilities == 0 && dl_user_bound_scale_value > 1) {
      this->model_status_ = HighsModelStatus::kNotset;
      if (info.primal_solution_status == kSolutionStatusFeasible)
        highsLogUser(options_.log_options, HighsLogType::kInfo,
                     "Option change leads to loss of primal feasibility\n");
      info.primal_solution_status = kSolutionStatusInfeasible;
      info.num_primal_infeasibilities = kHighsIllegalInfeasibilityCount;
    }
  } else if (!is_mip &&
             info.primal_solution_status == kSolutionStatusInfeasible) {
    highsLogUser(options_.log_options, HighsLogType::kInfo,
                 "Option change leads to gain of primal feasibility\n");
    info.primal_solution_status = kSolutionStatusFeasible;
    info.num_primal_infeasibilities = 0;
  }
  if (is_mip && dl_user_bound_scale) {
    // MIP with non-trivial bound scaling loses optimality
    this->model_status_ = HighsModelStatus::kNotset;
    if (dl_user_bound_scale < 0) {
      // MIP with negative bound scaling exponent loses feasibility
      if (info.primal_solution_status == kSolutionStatusFeasible) {
        highsLogUser(
            options_.log_options, HighsLogType::kInfo,
            "Option change leads to loss of primal feasibility for MIP\n");
      }
      info.primal_solution_status = kSolutionStatusInfeasible;
    }
  }
  if (dl_user_bound_scale) {
    // Update info and solution with respect to non-trivial user bound
    // scaling
    //
    // max and sum of infeasibilities scales: num is handled later
    info.objective_function_value *= dl_user_bound_scale_value;
    info.max_primal_infeasibility *= dl_user_bound_scale_value;
    info.sum_primal_infeasibilities *= dl_user_bound_scale_value;
    for (HighsInt iCol = 0; iCol < lp.num_col_; iCol++)
      this->solution_.col_value[iCol] *= dl_user_bound_scale_value;
    for (HighsInt iRow = 0; iRow < lp.num_row_; iRow++)
      this->solution_.row_value[iRow] *= dl_user_bound_scale_value;
    // Update LP with respect to non-trivial user bound scaling
    lp.userBoundScale(options_.user_bound_scale);
  }
  // Now consider whether options.user_cost_scale has changed
  HighsInt dl_user_cost_scale = 0;
  double dl_user_cost_scale_value = 1;
  const bool changed_user_cost_scale =
      options.user_cost_scale != lp.user_cost_scale_;
  bool user_cost_scale_ok =
      !changed_user_cost_scale ||
      model.userCostScaleOk(options.user_cost_scale, options.small_matrix_value,
                            options.large_matrix_value, options.infinite_cost);
  if (!user_cost_scale_ok) {
    options.user_cost_scale = lp.user_cost_scale_;
    highsLogUser(options_.log_options, HighsLogType::kError,
                 "New user cost scaling yields excessive cost coefficient: "
                 "reverting user cost scaling to %d\n",
                 int(options.user_cost_scale));
  } else if (changed_user_cost_scale) {
    dl_user_cost_scale = options.user_cost_scale - lp.user_cost_scale_;
    dl_user_cost_scale_value = std::pow(2, dl_user_cost_scale);
  }
  if (!is_mip) {
    // Now consider impact on dual feasibility of user cost scaling
    // and/or dual_feasibility_tolerance change
    double new_max_dual_infeasibility =
        info.max_dual_infeasibility * dl_user_cost_scale_value;
    if (new_max_dual_infeasibility > options.dual_feasibility_tolerance) {
      // Not dual feasible: only act if the model is currently dual
      // feasible or dl_user_bound_scale_value > 1
      if (info.num_dual_infeasibilities == 0 && dl_user_cost_scale_value > 1) {
        this->model_status_ = HighsModelStatus::kNotset;
        if (info.dual_solution_status == kSolutionStatusFeasible) {
          highsLogUser(options_.log_options, HighsLogType::kInfo,
                       "Option change leads to loss of dual feasibility\n");
          info.dual_solution_status = kSolutionStatusInfeasible;
        }
        info.num_dual_infeasibilities = kHighsIllegalInfeasibilityCount;
      }
    } else if (info.dual_solution_status == kSolutionStatusInfeasible) {
      highsLogUser(options_.log_options, HighsLogType::kInfo,
                   "Option change leads to gain of dual feasibility\n");
      info.dual_solution_status = kSolutionStatusFeasible;
      info.num_dual_infeasibilities = 0;
    }
  }
  if (dl_user_cost_scale) {
    if (is_mip) {
      // MIP with non-trivial cost scaling loses optimality
      this->model_status_ = HighsModelStatus::kNotset;
    }
    // Now update data and solution with respect to non-trivial user
    // cost scaling
    //
    // max and sum of infeasibilities scales: num is handled earlier
    info.objective_function_value *= dl_user_cost_scale_value;
    info.max_dual_infeasibility *= dl_user_cost_scale_value;
    info.sum_dual_infeasibilities *= dl_user_cost_scale_value;
    for (HighsInt iCol = 0; iCol < lp.num_col_; iCol++)
      this->solution_.col_dual[iCol] *= dl_user_cost_scale_value;
    for (HighsInt iRow = 0; iRow < lp.num_row_; iRow++)
      this->solution_.row_dual[iRow] *= dl_user_cost_scale_value;
    model.userCostScale(options.user_cost_scale);
  }
  if (this->model_status_ != HighsModelStatus::kOptimal) {
    if (info.primal_solution_status == kSolutionStatusFeasible &&
        info.dual_solution_status == kSolutionStatusFeasible) {
      highsLogUser(options_.log_options, HighsLogType::kInfo,
                   "Option change leads to gain of optimality\n");
      this->model_status_ = HighsModelStatus::kOptimal;
    }
  }
  if (!user_bound_scale_ok || !user_cost_scale_ok) return HighsStatus::kError;
  if (this->iis_.valid_ && options_.iis_strategy != this->iis_.strategy_)
    this->iis_.invalidate();
  return HighsStatus::kOk;
}